

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::VertexArrays::GetVertexArrayTest::iterate(GetVertexArrayTest *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  ContextInfo *this_00;
  TestContext *pTVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  Enum<int,_2UL> EVar7;
  MessageBuilder local_370;
  GetNameFunc local_1f0;
  int local_1e8;
  Enum<int,_2UL> local_1e0;
  MessageBuilder local_1d0;
  int local_4c;
  uint local_48;
  GLenum error;
  GLint result;
  uint local_38;
  int local_34;
  GLuint bo;
  GLuint vao;
  bool is_error;
  bool is_ok;
  ApiType AStack_28;
  bool is_arb_direct_state_access;
  byte local_21;
  long lStack_20;
  bool is_at_least_gl_45;
  Functions *gl;
  GetVertexArrayTest *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar1);
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  AStack_28.m_bits = (*pRVar3->_vptr_RenderContext[2])();
  vao = (GLuint)glu::ApiType::core(4,5);
  local_21 = glu::contextSupports((ContextType)AStack_28.m_bits,(ApiType)vao);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bo._3_1_ = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if (((local_21 & 1) != 0) || ((bool)bo._3_1_)) {
    bo._2_1_ = 1;
    bo._1_1_ = 0;
    local_34 = 0;
    local_38 = 0;
    (**(code **)(lStack_20 + 0x708))(1,&local_34);
    dVar2 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar2,"glCreateVertexArrays call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0xdd3);
    (**(code **)(lStack_20 + 0xd8))(local_34);
    dVar2 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar2,"glBindVertexArray call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0xdd6);
    (**(code **)(lStack_20 + 0x6c8))(1,&local_38);
    dVar2 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar2,"glCreateBuffers call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0xdd9);
    (**(code **)(lStack_20 + 0x40))(0x8893,local_38);
    dVar2 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar2,"glBindBuffer call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0xddc);
    local_48 = 0;
    (**(code **)(lStack_20 + 0xba8))(local_34,0x8895,&local_48);
    local_4c = (**(code **)(lStack_20 + 0x800))();
    if (local_4c != 0) {
      pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar5 = tcu::TestContext::getLog(pTVar4);
      tcu::TestLog::operator<<(&local_1d0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_1d0,(char (*) [41])"GetVertexArrayiv unexpectedly generated ");
      EVar7 = glu::getErrorStr(local_4c);
      local_1f0 = EVar7.m_getName;
      local_1e8 = EVar7.m_value;
      local_1e0.m_getName = local_1f0;
      local_1e0.m_value = local_1e8;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1e0);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [19])0x2a6abce);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1d0);
      bo._2_1_ = 0;
    }
    if (local_48 != local_38) {
      pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar5 = tcu::TestContext::getLog(pTVar4);
      tcu::TestLog::operator<<(&local_370,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_370,(char (*) [41])"GetVertexArrayiv was expected to return ");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_38);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [7])0x2a6afaf);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&local_48);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [27])" was observed. Test fails.");
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_370);
      bo._2_1_ = 0;
    }
    if (local_34 != 0) {
      (**(code **)(lStack_20 + 0x490))(1);
    }
    if (local_38 != 0) {
      (**(code **)(lStack_20 + 0x438))(1);
    }
    do {
      iVar1 = (**(code **)(lStack_20 + 0x800))();
    } while (iVar1 != 0);
    if ((bo._2_1_ & 1) == 0) {
      if ((bo._1_1_ & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_INTERNAL_ERROR,"Error");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GetVertexArrayTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Test objects. */
	glw::GLuint vao = 0;
	glw::GLuint bo  = 0;

	try
	{
		gl.genVertexArrays(1, &vao);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateVertexArrays call failed.");

		gl.bindVertexArray(vao);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

		gl.genBuffers(1, &bo);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers call failed.");

		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, bo);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

		glw::GLint result = 0;
		gl.getVertexArrayiv(vao, GL_ELEMENT_ARRAY_BUFFER_BINDING, &result);

		if (glw::GLenum error = gl.getError())
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "GetVertexArrayiv unexpectedly generated "
												<< glu::getErrorStr(error) << "error. Test fails."
												<< tcu::TestLog::EndMessage;

			is_ok = false;
		}

		if ((glw::GLuint)result != bo)
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "GetVertexArrayiv was expected to return "
												<< bo << ", but " << result << " was observed. Test fails."
												<< tcu::TestLog::EndMessage;

			is_ok = false;
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	if (vao)
	{
		gl.deleteVertexArrays(1, &vao);
	}

	if (bo)
	{
		gl.deleteBuffers(1, &bo);
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}